

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.c
# Opt level: O2

void growl(monst *mtmp)

{
  boolean bVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  
  if (((*(uint *)&mtmp->field_0x60 & 0xc0000) != 0x40000) || (mtmp->data->msound == '\0')) {
    return;
  }
  if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
LAB_00235691:
    pcVar3 = growl_sound(mtmp);
  }
  else {
    if (u.umonnum != u.umonster) {
      bVar1 = dmgtype(youmonst.data,0x24);
      if (bVar1 != '\0') goto LAB_00235691;
    }
    uVar2 = mt_random();
    pcVar3 = h_sounds[(ulong)uVar2 % 0x24];
  }
  pcVar4 = Monnam(mtmp);
  pcVar3 = vtense((char *)0x0,pcVar3);
  pline("%s %s!",pcVar4,pcVar3);
  if (flags.run != 0) {
    nomul(0,(char *)0x0);
  }
  wake_nearto((int)mtmp->mx,(int)mtmp->my,mtmp->data->mlevel * 0x12);
  return;
}

Assistant:

void growl(struct monst *mtmp)
{
    const char *growl_verb = 0;

    if (mtmp->msleeping || !mtmp->mcanmove || !mtmp->data->msound)
	return;

    /* presumably nearness and soundok checks have already been made */
    if (Hallucination)
	growl_verb = h_sounds[rn2(SIZE(h_sounds))];
    else
	growl_verb = growl_sound(mtmp);
    if (growl_verb) {
	pline("%s %s!", Monnam(mtmp), vtense(NULL, growl_verb));
	if (flags.run) nomul(0, NULL);
	wake_nearto(mtmp->mx, mtmp->my, mtmp->data->mlevel * 18);
    }
}